

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * tinyusdz::anon_unknown_173::print_rel_only
                   (string *__return_storage_ptr__,Relationship *rel,string *name,uint32_t indent)

{
  bool bVar1;
  ostream *poVar2;
  AttrMeta *pAVar3;
  uint32_t n;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream aoStack_1a0 [380];
  uint32_t local_24;
  string *psStack_20;
  uint32_t indent_local;
  string *name_local;
  Relationship *rel_local;
  
  local_24 = indent;
  psStack_20 = name;
  name_local = (string *)rel;
  rel_local = (Relationship *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1b0);
  poVar2 = ::std::operator<<(aoStack_1a0,"rel ");
  ::std::operator<<(poVar2,(string *)psStack_20);
  bVar1 = Relationship::has_value((Relationship *)name_local);
  if (bVar1) {
    bVar1 = Relationship::is_path((Relationship *)name_local);
    if (bVar1) {
      poVar2 = ::std::operator<<(aoStack_1a0," = ");
      ::std::operator<<(poVar2,(Path *)&name_local->_M_string_length);
    }
    else {
      bVar1 = Relationship::is_pathvector((Relationship *)name_local);
      if (bVar1) {
        poVar2 = ::std::operator<<(aoStack_1a0," = ");
        ::std::operator<<(poVar2,(vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)
                                 ((long)&name_local[6].field_2 + 8));
      }
      else {
        bVar1 = Relationship::is_blocked((Relationship *)name_local);
        if (bVar1) {
          ::std::operator<<(aoStack_1a0," = None");
        }
        else {
          ::std::operator<<(aoStack_1a0,"[InternalErrror]");
        }
      }
    }
  }
  pAVar3 = Relationship::metas((Relationship *)name_local);
  bVar1 = AttrMetas::authored(pAVar3);
  if (bVar1) {
    poVar2 = ::std::operator<<(aoStack_1a0," (\n");
    pAVar3 = Relationship::metas((Relationship *)name_local);
    print_attr_metas_abi_cxx11_
              (&local_1d0,(tinyusdz *)pAVar3,(AttrMeta *)(ulong)(local_24 + 1),indent);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_1d0);
    pprint::Indent_abi_cxx11_(&local_1f0,(pprint *)(ulong)local_24,n);
    poVar2 = ::std::operator<<(poVar2,(string *)&local_1f0);
    ::std::operator<<(poVar2,")");
    ::std::__cxx11::string::~string((string *)&local_1f0);
    ::std::__cxx11::string::~string((string *)&local_1d0);
  }
  ::std::operator<<(aoStack_1a0,"\n");
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string print_rel_only(const Relationship &rel, const std::string &name,
                           uint32_t indent) {
  std::stringstream ss;

  ss << "rel " << name;

  if (!rel.has_value()) {
    // nothing todo
  } else if (rel.is_path()) {
    ss << " = " << rel.targetPath;
  } else if (rel.is_pathvector()) {
    ss << " = " << rel.targetPathVector;
  } else if (rel.is_blocked()) {
    ss << " = None";
  } else {
    ss << "[InternalErrror]";
  }

  if (rel.metas().authored()) {
    ss << " (\n"
       << print_attr_metas(rel.metas(), indent + 1) << pprint::Indent(indent)
       << ")";
  }

  ss << "\n";

  return ss.str();
}